

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Metadpy_init_2(Display *dpy,char *name)

{
  metadpy *pmVar1;
  uint uVar2;
  XkbDescPtr xkb_00;
  XkbDescPtr xkb;
  metadpy *m;
  char *name_local;
  Display *dpy_local;
  
  pmVar1 = Metadpy;
  if (dpy == (Display *)0x0) {
    name_local = (char *)XOpenDisplay(name);
    if (name_local == (char *)0x0) {
      return -1;
    }
    pmVar1->field_0x68 = pmVar1->field_0x68 & 0xfb | 4;
  }
  else {
    Metadpy->field_0x68 = Metadpy->field_0x68 & 0xfb;
    name_local = (char *)dpy;
  }
  pmVar1->dpy = (Display *)name_local;
  pmVar1->screen =
       (Screen *)(*(long *)(name_local + 0xe8) + (long)*(int *)(name_local + 0xe0) * 0x80);
  pmVar1->root = pmVar1->screen->root;
  pmVar1->alt_mask = 8;
  pmVar1->super_mask = 0x40;
  xkb_00 = (XkbDescPtr)XkbGetKeyboard(name_local,0x7f,0x100);
  if (xkb_00 != (XkbDescPtr)0x0) {
    uVar2 = xkb_mask_modifier(xkb_00,"Alt");
    pmVar1->alt_mask = uVar2;
    uVar2 = xkb_mask_modifier(xkb_00,"Super");
    pmVar1->super_mask = uVar2;
    XkbFreeKeyboard(xkb_00,0,1);
  }
  pmVar1->cmap = pmVar1->screen->cmap;
  pmVar1->name = *(char **)(name_local + 0xd8);
  pmVar1->fd = *(wchar_t *)(Metadpy->dpy + 0x10);
  pmVar1->width = pmVar1->screen->width;
  pmVar1->height = pmVar1->screen->height;
  pmVar1->depth = pmVar1->screen->root_depth;
  pmVar1->black = pmVar1->screen->black_pixel;
  pmVar1->white = pmVar1->screen->white_pixel;
  pmVar1->bg = pmVar1->black;
  pmVar1->fg = pmVar1->white;
  pmVar1->zg = (1L << ((byte)pmVar1->depth & 0x3f)) - 1;
  pmVar1->field_0x68 = pmVar1->field_0x68 & 0xfd | (1 < pmVar1->depth) << 1;
  pmVar1->field_0x68 = pmVar1->field_0x68 & 0xfe | ((byte)pmVar1->field_0x68 >> 1 & 1) == 0;
  return 0;
}

Assistant:

static errr Metadpy_init_2(Display *dpy, const char *name)
{
	metadpy *m = Metadpy;
	XkbDescPtr xkb;
	
	/* Attempt to create a display if none given, otherwise use the given one */
	if (!dpy) {
		/* Attempt to open the display */
		dpy = XOpenDisplay(name);

		/* Failure */
		if (!dpy) return (-1);

		/* We will have to nuke it when done */
		m->nuke = 1;
	} else {
		/* We will not have to nuke it when done */
		m->nuke = 0;
	}


	/*** Save some information ***/

	/* Save the Display itself */
	m->dpy = dpy;

	/* Get the Screen and Virtual Root Window */
	m->screen = DefaultScreenOfDisplay(dpy);
	m->root = RootWindowOfScreen(m->screen);

	/* get the modifier key layout */
	m->alt_mask = Mod1Mask;
	m->super_mask = Mod4Mask;
	xkb = XkbGetKeyboard(dpy, XkbAllComponentsMask, XkbUseCoreKbd);
	if (xkb != NULL) {
		m->alt_mask = xkb_mask_modifier( xkb, "Alt" );
		m->super_mask = xkb_mask_modifier( xkb, "Super" );
		XkbFreeKeyboard( xkb, 0, True );
	}

	/* Get the default colormap */
	m->cmap = DefaultColormapOfScreen(m->screen);

	/* Extract the true name of the display */
	m->name = DisplayString(dpy);

	/* Extract the fd */
	m->fd = ConnectionNumber(Metadpy->dpy);

	/* Save the Size and Depth of the screen */
	m->width = WidthOfScreen(m->screen);
	m->height = HeightOfScreen(m->screen);
	m->depth = DefaultDepthOfScreen(m->screen);

	/* Save the Standard Colors */
	m->black = BlackPixelOfScreen(m->screen);
	m->white = WhitePixelOfScreen(m->screen);

	/*** Make some clever Guesses ***/

	/* Guess at the desired 'fg' and 'bg' Pixell's */
	m->bg = m->black;
	m->fg = m->white;

	/* Calculate the Maximum allowed Pixel value.  */
	m->zg = ((Pixell)1 << m->depth) - 1;

	/* Save various default Flag Settings */
	m->color = ((m->depth > 1) ? 1 : 0);
	m->mono = ((m->color) ? 0 : 1);

	/* Return "success" */
	return (0);
}